

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O0

int64_t __thiscall
disruptor::BusySpinStrategy::WaitFor<long,std::ratio<1l,1l>>
          (BusySpinStrategy *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1L>_> *timeout)

{
  bool bVar1;
  long *in_RSI;
  function<long_()> min_sequence;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  stop;
  time_point start;
  int64_t available_sequence;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  function<long_()> *in_stack_ffffffffffffff70;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Sequence *in_stack_ffffffffffffff88;
  undefined8 local_8;
  
  std::chrono::_V2::system_clock::now();
  std::chrono::operator+
            (in_stack_ffffffffffffff78,
             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff70);
  buildMinSequenceFunction
            (in_stack_ffffffffffffff88,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  do {
    in_stack_ffffffffffffff70 =
         (function<long_()> *)std::function<long_()>::operator()(in_stack_ffffffffffffff70);
    local_8 = in_stack_ffffffffffffff70;
    if (*in_RSI <= (long)in_stack_ffffffffffffff70) {
LAB_0012e235:
      std::function<long_()>::~function((function<long_()> *)0x12e23f);
      return (int64_t)local_8;
    }
    bVar1 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_ffffffffffffff78,
                       (memory_order)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    if (bVar1) {
      local_8 = (function<long_()> *)0xfffffffffffffffe;
      goto LAB_0012e235;
    }
    in_stack_ffffffffffffff78 =
         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *)std::chrono::_V2::system_clock::now();
    in_stack_ffffffffffffff6f =
         std::chrono::operator<=
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_ffffffffffffff70,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if ((bool)in_stack_ffffffffffffff6f) {
      local_8 = (function<long_()> *)0xfffffffffffffffd;
      goto LAB_0012e235;
    }
    SpinPause();
  } while( true );
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<R, P>& timeout) {
    int64_t available_sequence = kInitialCursorValue;

    const auto start = std::chrono::system_clock::now();
    const auto stop = start + timeout;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      if (stop <= std::chrono::system_clock::now()) return kTimeoutSignal;

      SpinPause();
    }

    return available_sequence;
  }